

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O1

int main(void)

{
  double dVar1;
  int iVar2;
  GLFWwindow *handle;
  int scancode;
  long lVar3;
  GLFWwindow **ppGVar4;
  double dVar5;
  
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
LAB_00106ddc:
    exit(1);
  }
  ppGVar4 = windows;
  lVar3 = 0;
  do {
    iVar2 = 0;
    handle = glfwCreateWindow(W,H,"Cursor testing",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    *ppGVar4 = handle;
    if (handle == (GLFWwindow *)0x0) {
      glfwTerminate();
      goto LAB_00106ddc;
    }
    glfwSetWindowPos(handle,(int)lVar3 * (W + 0x32) + 100,100);
    glfwSetWindowRefreshCallback(*ppGVar4,refresh_callback);
    glfwSetFramebufferSizeCallback(*ppGVar4,framebuffer_size_callback);
    glfwSetKeyCallback(*ppGVar4,key_callback);
    glfwSetWindowFocusCallback(*ppGVar4,focus_callback);
    glfwMakeContextCurrent(*ppGVar4);
    glClear(0x4000);
    glfwSwapBuffers(*ppGVar4);
    lVar3 = lVar3 + 1;
    ppGVar4 = ppGVar4 + 1;
  } while (lVar3 == 1);
  activeWindow = windows[0];
  key_callback((GLFWwindow *)0x0,0x48,scancode,1,iVar2);
  while( true ) {
    if (delay != 0) {
      dVar5 = glfwGetTime();
      lVar3 = 0;
      do {
        dVar1 = *(double *)((long)&commands[0].time + lVar3);
        if (((dVar1 != 0.0) || (NAN(dVar1))) && (3.0 <= dVar5 - dVar1)) {
          command_callback(*(int *)((long)&commands[0].key + lVar3));
          *(undefined8 *)((long)&commands[0].time + lVar3) = 0;
        }
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x80);
    }
    iVar2 = glfwWindowShouldClose(windows[0]);
    if (iVar2 != 0) break;
    iVar2 = glfwWindowShouldClose(windows[1]);
    glfwPollEvents();
    if (iVar2 != 0) {
LAB_00106deb:
      glfwTerminate();
      exit(0);
    }
  }
  glfwPollEvents();
  goto LAB_00106deb;
}

Assistant:

int main(void)
{
    int i;
    GLboolean running = GL_TRUE;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    for (i = 0; i < 2; i++)
    {
        windows[i] = glfwCreateWindow(W, H, "Cursor testing", NULL, NULL);

        if (!windows[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetWindowPos(windows[i], 100 + (i & 1) * (W + 50), 100);

        glfwSetWindowRefreshCallback(windows[i], refresh_callback);
        glfwSetFramebufferSizeCallback(windows[i], framebuffer_size_callback);
        glfwSetKeyCallback(windows[i], key_callback);
        glfwSetWindowFocusCallback(windows[i], focus_callback);

        glfwMakeContextCurrent(windows[i]);
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(windows[i]);
    }

    activeWindow = windows[0];

    key_callback(NULL, GLFW_KEY_H, 0, GLFW_PRESS, 0);

    while (running)
    {
        if (delay)
        {
            int i;
            double t = glfwGetTime();

            for (i = 0; i < CommandCount; i++)
            {
                if (commands[i].time != 0 && t - commands[i].time >= 3.0)
                {
                    command_callback(commands[i].key);
                    commands[i].time = 0;
                }
            }
        }

        running = !(glfwWindowShouldClose(windows[0]) || glfwWindowShouldClose(windows[1]));

        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}